

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::NamedMaterial(ParsedScene *this,string *name,FileLoc loc)

{
  string local_30;
  
  if (this->currentApiState == OptionsBlock) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[14]>
              (&local_30,
               "Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [14])0x4fd326);
    Error(&loc,local_30._M_dataplus._M_p);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::__cxx11::string::_M_assign((string *)&this->graphicsState->currentMaterialName);
      this->graphicsState->currentMaterialIndex = -1;
      return;
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[14]>
              (&local_30,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [14])0x4fd326);
    Error(&loc,local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ParsedScene::NamedMaterial(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("NamedMaterial");
    graphicsState->currentMaterialName = name;
    graphicsState->currentMaterialIndex = -1;
}